

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O3

index_t __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::claimCapacity
          (ManyToOneRingBuffer *this,index_t requiredCapacity)

{
  long *plVar1;
  AtomicBuffer *pAVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  undefined8 local_50;
  
  uVar8 = (long)this->m_capacity - 1;
  pAVar2 = this->m_buffer;
  iVar9 = this->m_headCachePositionIndex;
  AtomicBuffer::boundsCheck(pAVar2,iVar9,8);
  local_50 = *(undefined8 *)(pAVar2->m_buffer + iVar9);
  do {
    pAVar2 = this->m_buffer;
    iVar9 = this->m_tailPositionIndex;
    AtomicBuffer::boundsCheck(pAVar2,iVar9,8);
    lVar3 = *(long *)(pAVar2->m_buffer + iVar9);
    iVar9 = this->m_capacity;
    iVar4 = (int)lVar3;
    if (((int)local_50 - iVar4) + iVar9 < requiredCapacity) {
      pAVar2 = this->m_buffer;
      iVar9 = this->m_headPositionIndex;
      AtomicBuffer::boundsCheck(pAVar2,iVar9,8);
      local_50 = *(undefined8 *)(pAVar2->m_buffer + iVar9);
      if (((int)local_50 - iVar4) + this->m_capacity < requiredCapacity) {
        return -2;
      }
      pAVar2 = this->m_buffer;
      iVar9 = this->m_headCachePositionIndex;
      AtomicBuffer::boundsCheck(pAVar2,iVar9,8);
      *(undefined8 *)(pAVar2->m_buffer + iVar9) = local_50;
      iVar9 = this->m_capacity;
    }
    uVar6 = (long)iVar4 & uVar8;
    iVar4 = (int)uVar6;
    uVar10 = (ulong)(uint)(iVar9 - iVar4);
    if (iVar9 - iVar4 < requiredCapacity) {
      uVar5 = (uint)uVar8;
      if ((int)(uVar5 & (uint)local_50) < requiredCapacity) {
        pAVar2 = this->m_buffer;
        iVar9 = this->m_headPositionIndex;
        AtomicBuffer::boundsCheck(pAVar2,iVar9,8);
        local_50 = *(undefined8 *)(pAVar2->m_buffer + iVar9);
        if ((int)(uVar5 & (uint)local_50) < requiredCapacity) {
          return -2;
        }
        pAVar2 = this->m_buffer;
        iVar9 = this->m_headCachePositionIndex;
        AtomicBuffer::boundsCheck(pAVar2,iVar9,8);
        *(undefined8 *)(pAVar2->m_buffer + iVar9) = local_50;
      }
    }
    else {
      uVar10 = 0;
    }
    pAVar2 = this->m_buffer;
    iVar9 = this->m_tailPositionIndex;
    AtomicBuffer::boundsCheck(pAVar2,iVar9,8);
    plVar1 = (long *)(pAVar2->m_buffer + iVar9);
    LOCK();
    lVar7 = *plVar1;
    if (lVar3 == lVar7) {
      *plVar1 = (long)(int)uVar10 + requiredCapacity + lVar3;
      lVar7 = lVar3;
    }
    UNLOCK();
  } while (lVar7 != lVar3);
  if ((int)uVar10 != 0) {
    pAVar2 = this->m_buffer;
    AtomicBuffer::boundsCheck(pAVar2,iVar4,8);
    *(ulong *)(pAVar2->m_buffer + uVar6) = uVar10 | 0xffffffff00000000;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

util::index_t claimCapacity(util::index_t requiredCapacity)
    {
        const util::index_t mask = m_capacity - 1;
        std::int64_t head = m_buffer.getInt64Volatile(m_headCachePositionIndex);

        std::int64_t tail;
        util::index_t tailIndex;
        util::index_t padding;
        do
        {
            tail = m_buffer.getInt64Volatile(m_tailPositionIndex);
            const util::index_t availableCapacity = m_capacity - static_cast<util::index_t>(tail - head);

            if (requiredCapacity > availableCapacity)
            {
                head = m_buffer.getInt64Volatile(m_headPositionIndex);

                if (requiredCapacity > (m_capacity - static_cast<util::index_t>(tail - head)))
                {
                    return INSUFFICIENT_CAPACITY;
                }

                m_buffer.putInt64Ordered(m_headCachePositionIndex, head);
            }

            padding = 0;
            tailIndex = static_cast<util::index_t>(tail & mask);
            const util::index_t toBufferEndLength = m_capacity - tailIndex;

            if (requiredCapacity > toBufferEndLength)
            {
                std::int32_t headIndex = static_cast<std::int32_t>(head & mask);

                if (requiredCapacity > headIndex)
                {
                    head = m_buffer.getInt64Volatile(m_headPositionIndex);
                    headIndex = static_cast<std::int32_t>(head & mask);

                    if (requiredCapacity > headIndex)
                    {
                        return INSUFFICIENT_CAPACITY;
                    }

                    m_buffer.putInt64Ordered(m_headCachePositionIndex, head);
                }

                padding = toBufferEndLength;
            }
        }
        while (!m_buffer.compareAndSetInt64(m_tailPositionIndex, tail, tail + requiredCapacity + padding));

        if (0 != padding)
        {
            m_buffer.putInt64Ordered(
                tailIndex, RecordDescriptor::makeHeader(padding, RecordDescriptor::PADDING_MSG_TYPE_ID));
            tailIndex = 0;
        }

        return tailIndex;
    }